

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::BlindFactor::BlindFactor(BlindFactor *this,string *hex_string)

{
  long lVar1;
  undefined8 uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CfdException *this_01;
  allocator_type *in_stack_ffffffffffffff28;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  undefined1 local_b8 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  string local_68 [48];
  unsigned_long local_38;
  CfdSourceLocation local_30;
  string *local_18;
  string *hex_string_local;
  BlindFactor *this_local;
  
  this->_vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_009eba18;
  local_18 = hex_string;
  hex_string_local = (string *)this;
  ByteData256::ByteData256(&this->data_);
  lVar1 = ::std::__cxx11::string::size();
  if (lVar1 != 0x40) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x2a7;
    local_30.funcname = "BlindFactor";
    local_38 = ::std::__cxx11::string::size();
    logger::warn<unsigned_long>(&local_30,"Value hex-string-length Invalid. length={}.",&local_38);
    data._6_1_ = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    this_01 = (CfdException *)((long)&data + 7);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,"Value hex string length Invalid.",(allocator *)this_01)
    ;
    CfdException::CfdException(this_01,(CfdError)((ulong)uVar2 >> 0x20),in_stack_ffffffffffffff00);
    data._6_1_ = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_18);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crbegin(in_stack_fffffffffffffef8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crend
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff47;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4a34b8);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4a34e7);
  ByteData256::ByteData256
            ((ByteData256 *)&stack0xffffffffffffff28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_b8 + 0x10));
  ByteData256::operator=(&this->data_,(ByteData256 *)&stack0xffffffffffffff28);
  ByteData256::~ByteData256((ByteData256 *)0x4a351f);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return;
}

Assistant:

BlindFactor::BlindFactor(const std::string &hex_string) : data_() {
  if (hex_string.size() != (kByteData256Length * 2)) {
    warn(
        CFD_LOG_SOURCE, "Value hex-string-length Invalid. length={}.",
        hex_string.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Value hex string length Invalid.");
  }
  const std::vector<uint8_t> &data = StringUtil::StringToByte(hex_string);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  data_ = ByteData256(reverse_buffer);
}